

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::restart(Connector *this)

{
  Connector *this_local;
  
  EventLoop::assertInLoopThread(this->m_loop);
  setState(this,kDisconnected);
  this->m_retryDelayMs = 500;
  this->m_connect = true;
  startInLoop(this);
  return;
}

Assistant:

void Connector::restart()
{
	m_loop->assertInLoopThread();
	setState(kDisconnected);
	m_retryDelayMs = kInitRetryDelayMs;
	m_connect = true;
	startInLoop();
}